

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void list_account_details(int account_number)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  long local_240;
  ifstream inFile;
  undefined1 local_30 [4];
  int flag;
  Account account;
  int account_number_local;
  
  account._28_4_ = account_number;
  Account::Account((Account *)local_30);
  bVar1 = false;
  std::ifstream::ifstream(&local_240);
  std::ifstream::open((char *)&local_240,0x107145);
  bVar2 = std::ios::operator!((ios *)((long)&local_240 + *(long *)(local_240 + -0x18)));
  if ((bVar2 & 1) == 0) {
    std::operator<<((ostream *)&std::cout,"\nBALANCE DETAILS\n");
    while( true ) {
      plVar5 = (long *)std::istream::read((char *)&local_240,(long)local_30);
      bVar3 = std::ios::operator_cast_to_bool((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
      if (!bVar3) break;
      iVar4 = Account::return_account_num((Account *)local_30);
      if (iVar4 == account._28_4_) {
        Account::show_account((Account *)local_30);
        bVar1 = true;
      }
    }
    std::ifstream::close();
    if (!bVar1) {
      std::operator<<((ostream *)&std::cout,"\n\nAccount number does not exist");
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"File could not be open !! Press any Key...");
  }
  std::ifstream::~ifstream(&local_240);
  return;
}

Assistant:

void list_account_details(int account_number)
{
    /*!
     * It is a helper function that print details of account with th account_number
     */
    Account account;
    int flag=0;
    std::ifstream inFile;
    inFile.open("Account.dat",std::ios::binary);
    if(!inFile)
    {
        std::cout<<"File could not be open !! Press any Key...";
        return;
    }
    std::cout<<"\nBALANCE DETAILS\n";
    while(inFile.read((char *) &account, sizeof(Account)))
    {
        if(account.return_account_num()==account_number)
        {
            account.show_account();
            flag=1;
        }
    }
    inFile.close();
    if(flag==0)
        std::cout<<"\n\nAccount number does not exist";
}